

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_hash_table.hpp
# Opt level: O1

void __thiscall
poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::compact_hash_table
          (compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *this,
          uint32_t univ_bits,uint32_t capa_bits)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint64_t uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 in_XMM1 [16];
  compact_vector local_48;
  
  uVar2 = -1L << ((ulong)univ_bits & 0x3f) ^ 0xffffffffffffffff;
  *(undefined8 *)
   ((long)&(this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)((long)&(this->table_).size_ + 4) = 0;
  *(undefined8 *)((long)&(this->table_).mask_ + 4) = 0;
  *(undefined8 *)((long)&(this->table_).width_ + 4) = 0;
  *(undefined8 *)((long)&this->size_ + 4) = 0;
  *(undefined8 *)((long)&this->max_size_ + 4) = 0;
  (this->hasher_).univ_size_.mask_ = 0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table_).size_ = 0;
  (this->table_).mask_ = 0;
  (this->table_).width_ = 0;
  this->size_ = 0;
  (this->quo_size_).mask_ = 0;
  this->quo_shift_ = 0;
  (this->univ_size_).bits_ = univ_bits;
  (this->univ_size_).mask_ = uVar2;
  uVar4 = 0xc;
  if (0xc < capa_bits) {
    uVar4 = (ulong)capa_bits;
  }
  uVar6 = -1L << (uVar4 & 0x3f);
  (this->capa_size_).bits_ = (uint32_t)uVar4;
  (this->capa_size_).mask_ = ~uVar6;
  uVar3 = univ_bits - (uint32_t)uVar4;
  uVar4 = ~(-1L << ((ulong)uVar3 & 0x3f));
  (this->quo_size_).bits_ = uVar3;
  (this->quo_size_).mask_ = uVar4;
  this->quo_shift_ = 9;
  this->quo_invmask_ = ~(uVar4 << 9);
  auVar1 = vcvtusi2sd_avx512f(in_XMM1,uVar6 * -0x50);
  auVar7._0_8_ = auVar1._0_8_ / 100.0;
  auVar7._8_8_ = auVar1._8_8_;
  uVar5 = vcvttsd2usi_avx512f(auVar7);
  this->max_size_ = uVar5;
  (this->hasher_).shift_ = (univ_bits >> 1) + 1;
  (this->hasher_).univ_size_.bits_ = univ_bits;
  (this->hasher_).univ_size_.mask_ = uVar2;
  compact_vector::compact_vector(&local_48,-uVar6,uVar3 + 9,0x1fd);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&(this->table_).chunks_,&local_48);
  (this->table_).width_ = local_48.width_;
  (this->table_).size_ = local_48.size_;
  (this->table_).mask_ = local_48.mask_;
  if (local_48.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.chunks_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.chunks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.chunks_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

explicit compact_hash_table(uint32_t univ_bits, uint32_t capa_bits = min_capa_bits) {
        univ_size_ = size_p2{univ_bits};
        capa_size_ = size_p2{std::max(min_capa_bits, capa_bits)};

        assert(capa_size_.bits() <= univ_size_.bits());

        quo_size_ = size_p2{univ_size_.bits() - capa_size_.bits()};
        quo_shift_ = 2 + val_bits;
        quo_invmask_ = ~(quo_size_.mask() << quo_shift_);

        max_size_ = static_cast<uint64_t>(capa_size_.size() * MaxFactor / 100.0);

        hasher_ = Hasher{univ_size_.bits()};
        table_ = compact_vector{capa_size_.size(), quo_size_.bits() + val_bits + 2, (val_mask << 2) | 1ULL};
    }